

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::join<char_const(&)[91]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [91])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> SStack_1108;
  
  StringStream<4096UL,_4096UL>::StringStream(&SStack_1108);
  StringStream<4096UL,_4096UL>::operator<<(&SStack_1108,(char *)this);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&SStack_1108);
  StringStream<4096UL,_4096UL>::~StringStream(&SStack_1108);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}